

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralItem,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcProduct *this;
  
  this = (IfcProduct *)operator_new(0x128);
  *(undefined ***)&this->field_0x110 = &PTR__Object_00836880;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  *(char **)&this[1].super_IfcObject.field_0x8 = "IfcStructuralItem";
  Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct(this,&PTR_construction_vtable_24__00847b30);
  *(undefined ***)&this->super_IfcObject = &PTR__IfcStructuralItem_00847a50;
  *(undefined ***)&this->field_0x110 = &PTR__IfcStructuralItem_00847b18;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcStructuralItem_00847a78;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcStructuralItem_00847aa0;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcStructuralItem_00847ac8;
  *(undefined ***)&this->field_0x100 = &PTR__IfcStructuralItem_00847af0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcProduct>(db,params,this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }